

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

int __thiscall helics::CommonCore::generateMapObjectCounter(CommonCore *this)

{
  bool bVar1;
  BrokerState BVar2;
  BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*> *this_00;
  size_type sVar3;
  long in_RDI;
  FedInfo *fed;
  const_iterator __end1;
  const_iterator __begin1;
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
  *__range1;
  int result;
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
  *in_stack_ffffffffffffffb0;
  BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*> local_48;
  BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*> local_30;
  long local_18;
  int local_c;
  
  BVar2 = BrokerBase::getBrokerState((BrokerBase *)0x54718b);
  local_c = (int)BVar2;
  local_18 = in_RDI + 0x470;
  gmlc::containers::
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>::
  begin(in_stack_ffffffffffffffb0);
  gmlc::containers::
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>::end
            (in_stack_ffffffffffffffb0);
  while( true ) {
    bVar1 = gmlc::containers::
            BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>::operator!=
                      (&local_30,&local_48);
    if (!bVar1) break;
    this_00 = (BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*> *)
              gmlc::containers::
              BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>::operator*
                        (&local_30);
    local_c = (uint)*(byte *)&this_00->ptr + local_c;
    gmlc::containers::BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>::
    operator++(this_00);
  }
  sVar3 = HandleManager::size((HandleManager *)0x547213);
  return (int)sVar3 + local_c;
}

Assistant:

int CommonCore::generateMapObjectCounter() const
{
    int result = static_cast<int>(getBrokerState());
    for (const auto& fed : loopFederates) {
        result += static_cast<int>(fed.state);
    }
    result += static_cast<int>(loopHandles.size());
    return result;
}